

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# descriptor.cc
# Opt level: O1

Symbol __thiscall
google::protobuf::DescriptorPool::Tables::FindByNameHelper
          (Tables *this,DescriptorPool *pool,string *name)

{
  char *pcVar1;
  _Node **pp_Var2;
  ulong uVar3;
  DescriptorPool *pool_00;
  Tables *this_00;
  bool bVar4;
  int iVar5;
  Type TVar6;
  ulong uVar7;
  Symbol *pSVar8;
  char cVar9;
  char *pcVar10;
  _Node *p_Var12;
  _Node *p_Var13;
  Symbol SVar14;
  MutexLockMaybe lock;
  MutexLockMaybe local_38;
  anon_union_8_7_bfa3a334_for_Symbol_2 aVar11;
  
  local_38.mu_ = pool->mutex_;
  if (local_38.mu_ != (Mutex *)0x0) {
    internal::Mutex::Lock(local_38.mu_);
  }
  pcVar1 = (name->_M_dataplus)._M_p;
  cVar9 = *pcVar1;
  if (cVar9 == '\0') {
    uVar7 = 0;
  }
  else {
    uVar7 = 0;
    pcVar10 = pcVar1;
    do {
      pcVar10 = pcVar10 + 1;
      uVar7 = (long)cVar9 + uVar7 * 5;
      cVar9 = *pcVar10;
    } while (cVar9 != '\0');
  }
  pp_Var2 = (this->symbols_by_name_).
            super_unordered_map<const_char_*,_google::protobuf::(anonymous_namespace)::Symbol,_google::protobuf::hash<const_char_*>,_google::protobuf::streq,_std::allocator<std::pair<const_char_*const,_google::protobuf::(anonymous_namespace)::Symbol>_>_>
            .
            super___unordered_map<const_char_*,_google::protobuf::(anonymous_namespace)::Symbol,_google::protobuf::hash<const_char_*>,_google::protobuf::streq,_std::allocator<std::pair<const_char_*const,_google::protobuf::(anonymous_namespace)::Symbol>_>,_false>
            .
            super__Hashtable<const_char_*,_std::pair<const_char_*const,_google::protobuf::(anonymous_namespace)::Symbol>,_std::allocator<std::pair<const_char_*const,_google::protobuf::(anonymous_namespace)::Symbol>_>,_std::_Select1st<std::pair<const_char_*const,_google::protobuf::(anonymous_namespace)::Symbol>_>,_google::protobuf::streq,_google::protobuf::hash<const_char_*>,_std::tr1::__detail::_Mod_range_hashing,_std::tr1::__detail::_Default_ranged_hash,_std::tr1::__detail::_Prime_rehash_policy,_false,_false,_true>
            ._M_buckets;
  uVar3 = (this->symbols_by_name_).
          super_unordered_map<const_char_*,_google::protobuf::(anonymous_namespace)::Symbol,_google::protobuf::hash<const_char_*>,_google::protobuf::streq,_std::allocator<std::pair<const_char_*const,_google::protobuf::(anonymous_namespace)::Symbol>_>_>
          .
          super___unordered_map<const_char_*,_google::protobuf::(anonymous_namespace)::Symbol,_google::protobuf::hash<const_char_*>,_google::protobuf::streq,_std::allocator<std::pair<const_char_*const,_google::protobuf::(anonymous_namespace)::Symbol>_>,_false>
          .
          super__Hashtable<const_char_*,_std::pair<const_char_*const,_google::protobuf::(anonymous_namespace)::Symbol>,_std::allocator<std::pair<const_char_*const,_google::protobuf::(anonymous_namespace)::Symbol>_>,_std::_Select1st<std::pair<const_char_*const,_google::protobuf::(anonymous_namespace)::Symbol>_>,_google::protobuf::streq,_google::protobuf::hash<const_char_*>,_std::tr1::__detail::_Mod_range_hashing,_std::tr1::__detail::_Default_ranged_hash,_std::tr1::__detail::_Prime_rehash_policy,_false,_false,_true>
          ._M_bucket_count;
  p_Var13 = pp_Var2[uVar7 % uVar3];
  p_Var12 = (_Node *)0x0;
  if (p_Var13 != (_Node *)0x0) {
    do {
      iVar5 = strcmp(pcVar1,(p_Var13->_M_v).first);
      p_Var12 = p_Var13;
      if (iVar5 == 0) break;
      p_Var13 = p_Var13->_M_next;
      p_Var12 = (_Node *)0x0;
    } while (p_Var13 !=
             (_Hash_node<std::pair<const_char_*const,_google::protobuf::(anonymous_namespace)::Symbol>,_false>
              *)0x0);
  }
  if (p_Var12 == (_Node *)0x0) {
    p_Var12 = pp_Var2[uVar3];
  }
  pSVar8 = &(p_Var12->_M_v).second;
  if (p_Var12 == pp_Var2[uVar3]) {
    pSVar8 = (Symbol *)&(anonymous_namespace)::kNullSymbol;
  }
  aVar11 = (anon_union_8_7_bfa3a334_for_Symbol_2)(pSVar8->field_1).descriptor;
  TVar6 = pSVar8->type;
  if ((TVar6 == NULL_SYMBOL) && (pool_00 = pool->underlay_, pool_00 != (DescriptorPool *)0x0)) {
    this_00 = (pool_00->tables_).ptr_;
    if (this_00 == (Tables *)0x0) {
      __assert_fail("ptr_ != NULL",
                    "/workspace/llm4binary/github/license_all_cmakelists_1510/chai2010[P]protorpc/./src/google/protobuf/stubs/common.h"
                    ,0x1e2,
                    "C *google::protobuf::internal::scoped_ptr<google::protobuf::DescriptorPool::Tables>::operator->() const [C = google::protobuf::DescriptorPool::Tables]"
                   );
    }
    SVar14 = FindByNameHelper(this_00,pool_00,name);
    aVar11 = SVar14.field_1;
    TVar6 = SVar14.type;
  }
  if ((TVar6 == NULL_SYMBOL) && (bVar4 = TryFindSymbolInFallbackDatabase(pool,name), bVar4)) {
    pcVar1 = (name->_M_dataplus)._M_p;
    cVar9 = *pcVar1;
    if (cVar9 == '\0') {
      uVar7 = 0;
    }
    else {
      uVar7 = 0;
      pcVar10 = pcVar1;
      do {
        pcVar10 = pcVar10 + 1;
        uVar7 = (long)cVar9 + uVar7 * 5;
        cVar9 = *pcVar10;
      } while (cVar9 != '\0');
    }
    pp_Var2 = (this->symbols_by_name_).
              super_unordered_map<const_char_*,_google::protobuf::(anonymous_namespace)::Symbol,_google::protobuf::hash<const_char_*>,_google::protobuf::streq,_std::allocator<std::pair<const_char_*const,_google::protobuf::(anonymous_namespace)::Symbol>_>_>
              .
              super___unordered_map<const_char_*,_google::protobuf::(anonymous_namespace)::Symbol,_google::protobuf::hash<const_char_*>,_google::protobuf::streq,_std::allocator<std::pair<const_char_*const,_google::protobuf::(anonymous_namespace)::Symbol>_>,_false>
              .
              super__Hashtable<const_char_*,_std::pair<const_char_*const,_google::protobuf::(anonymous_namespace)::Symbol>,_std::allocator<std::pair<const_char_*const,_google::protobuf::(anonymous_namespace)::Symbol>_>,_std::_Select1st<std::pair<const_char_*const,_google::protobuf::(anonymous_namespace)::Symbol>_>,_google::protobuf::streq,_google::protobuf::hash<const_char_*>,_std::tr1::__detail::_Mod_range_hashing,_std::tr1::__detail::_Default_ranged_hash,_std::tr1::__detail::_Prime_rehash_policy,_false,_false,_true>
              ._M_buckets;
    uVar3 = (this->symbols_by_name_).
            super_unordered_map<const_char_*,_google::protobuf::(anonymous_namespace)::Symbol,_google::protobuf::hash<const_char_*>,_google::protobuf::streq,_std::allocator<std::pair<const_char_*const,_google::protobuf::(anonymous_namespace)::Symbol>_>_>
            .
            super___unordered_map<const_char_*,_google::protobuf::(anonymous_namespace)::Symbol,_google::protobuf::hash<const_char_*>,_google::protobuf::streq,_std::allocator<std::pair<const_char_*const,_google::protobuf::(anonymous_namespace)::Symbol>_>,_false>
            .
            super__Hashtable<const_char_*,_std::pair<const_char_*const,_google::protobuf::(anonymous_namespace)::Symbol>,_std::allocator<std::pair<const_char_*const,_google::protobuf::(anonymous_namespace)::Symbol>_>,_std::_Select1st<std::pair<const_char_*const,_google::protobuf::(anonymous_namespace)::Symbol>_>,_google::protobuf::streq,_google::protobuf::hash<const_char_*>,_std::tr1::__detail::_Mod_range_hashing,_std::tr1::__detail::_Default_ranged_hash,_std::tr1::__detail::_Prime_rehash_policy,_false,_false,_true>
            ._M_bucket_count;
    p_Var13 = pp_Var2[uVar7 % uVar3];
    p_Var12 = (_Node *)0x0;
    if (p_Var13 != (_Node *)0x0) {
      do {
        iVar5 = strcmp(pcVar1,(p_Var13->_M_v).first);
        p_Var12 = p_Var13;
        if (iVar5 == 0) break;
        p_Var13 = p_Var13->_M_next;
        p_Var12 = (_Node *)0x0;
      } while (p_Var13 !=
               (_Hash_node<std::pair<const_char_*const,_google::protobuf::(anonymous_namespace)::Symbol>,_false>
                *)0x0);
    }
    if (p_Var12 == (_Node *)0x0) {
      p_Var12 = pp_Var2[uVar3];
    }
    pSVar8 = &(p_Var12->_M_v).second;
    if (p_Var12 == pp_Var2[uVar3]) {
      pSVar8 = (Symbol *)&(anonymous_namespace)::kNullSymbol;
    }
    aVar11 = (anon_union_8_7_bfa3a334_for_Symbol_2)(pSVar8->field_1).descriptor;
    TVar6 = pSVar8->type;
  }
  internal::MutexLockMaybe::~MutexLockMaybe(&local_38);
  SVar14._4_4_ = 0;
  SVar14.type = TVar6;
  SVar14.field_1.descriptor = aVar11.descriptor;
  return SVar14;
}

Assistant:

Symbol DescriptorPool::Tables::FindByNameHelper(
    const DescriptorPool* pool, const string& name) const {
  MutexLockMaybe lock(pool->mutex_);
  Symbol result = FindSymbol(name);

  if (result.IsNull() && pool->underlay_ != NULL) {
    // Symbol not found; check the underlay.
    result =
      pool->underlay_->tables_->FindByNameHelper(pool->underlay_, name);
  }

  if (result.IsNull()) {
    // Symbol still not found, so check fallback database.
    if (pool->TryFindSymbolInFallbackDatabase(name)) {
      result = FindSymbol(name);
    }
  }

  return result;
}